

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Load_Char(FT_Face face,FT_ULong char_code,FT_Int32 load_flags)

{
  uint uVar1;
  FT_Error FVar2;
  FT_UInt glyph_index;
  
  if (face != (FT_Face)0x0) {
    glyph_index = (FT_UInt)char_code;
    if (face->charmap != (FT_CharMap)0x0) {
      uVar1 = (*(code *)(face->charmap[1].face)->style_flags)();
      glyph_index = 0;
      if (uVar1 < (uint)face->num_glyphs) {
        glyph_index = uVar1;
      }
    }
    FVar2 = FT_Load_Glyph(face,glyph_index,load_flags);
    return FVar2;
  }
  return 0x23;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Char( FT_Face   face,
                FT_ULong  char_code,
                FT_Int32  load_flags )
  {
    FT_UInt  glyph_index;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    glyph_index = (FT_UInt)char_code;
    if ( face->charmap )
      glyph_index = FT_Get_Char_Index( face, char_code );

    return FT_Load_Glyph( face, glyph_index, load_flags );
  }